

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O2

ExprNode * __thiscall Translator::visit(Translator *this,CallNode *callNode)

{
  ExpListNode *pEVar1;
  int iVar2;
  undefined4 extraout_var;
  ExpList *this_00;
  CALL *this_01;
  NAME *this_02;
  Label *this_03;
  ExpList *args;
  ExpListNode **ppEVar3;
  char callLabel [200];
  
  ppEVar3 = &callNode->parameters;
  args = (ExpList *)0x0;
  while (pEVar1 = *ppEVar3, pEVar1 != (ExpListNode *)0x0) {
    iVar2 = (*(pEVar1->exp->super_StmtNode).super_ASTNode._vptr_ASTNode[4])(pEVar1->exp,this);
    this_00 = (ExpList *)operator_new(0x20);
    ExpList::ExpList(this_00,(ExprNode *)CONCAT44(extraout_var,iVar2),args);
    args = this_00;
    ppEVar3 = &pEVar1->next;
  }
  sprintf(callLabel,"func_%s_call",(callNode->id->super_ExpNode).lexeme);
  this_01 = (CALL *)operator_new(0x20);
  this_02 = (NAME *)operator_new(0x18);
  this_03 = (Label *)operator_new(0x10);
  Label::Label(this_03,callLabel);
  NAME::NAME(this_02,this_03);
  CALL::CALL(this_01,(ExprNode *)this_02,args);
  return &this_01->super_ExprNode;
}

Assistant:

ExprNode *Translator::visit(CallNode *callNode) {
    ExpListNode *param = callNode->getParameters(); // pega os parametros da chamada
    ExpList *lcall = NULL;
    while (param) {// se tiver parametros
        ExprNode *exp = param->getExp()->accept(this);// acessa o no
        lcall = new ExpList(exp, lcall);// cria uma lista de exp
        param = param->getNext();// vai para o proximo param
    }
    char callLabel[200];
    sprintf(callLabel, "func_%s_call", callNode->getId()->getLexeme());// cria um label para a chamada
    return new CALL(new NAME(new Label(callLabel)), lcall);// cria o call node com a funcao e seus parametros
}